

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hxx
# Opt level: O2

size_t lineage::loadNodes(string *fileName,Problem *problem)

{
  pointer pNVar1;
  pointer puVar2;
  size_t sVar3;
  istream *piVar4;
  double *pdVar5;
  size_t local_260;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_258;
  Node node;
  ifstream file;
  
  pNVar1 = (problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
      super__Vector_impl_data._M_finish != pNVar1) {
    (problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar1;
  }
  local_258 = &problem->node_offsets;
  puVar2 = (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (problem->node_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  _file = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (local_258,(unsigned_long *)&file);
  std::ifstream::ifstream(&file,(string *)fileName,_S_in);
  local_260 = 0;
  while( true ) {
    piVar4 = (istream *)std::istream::operator>>((istream *)&file,&node.t);
    piVar4 = (istream *)std::istream::operator>>(piVar4,&node.id);
    piVar4 = (istream *)std::istream::operator>>(piVar4,&node.cx);
    pdVar5 = (double *)std::istream::operator>>(piVar4,&node.cy);
    piVar4 = std::istream::_M_extract<double>(pdVar5);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    if ((long)(problem->node_offsets).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(problem->node_offsets).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 == (long)node.t) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_258,&local_260);
    }
    std::vector<lineage::Node,_std::allocator<lineage::Node>_>::push_back(&problem->nodes,&node);
    local_260 = local_260 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_258,&local_260);
  std::ifstream::close();
  sVar3 = local_260;
  std::ifstream::~ifstream(&file);
  return sVar3;
}

Assistant:

inline
size_t loadNodes(const std::string& fileName, Problem& problem)
{
    problem.nodes.clear();
    problem.node_offsets.clear();
    problem.node_offsets.push_back(0);

    std::ifstream file(fileName);

    Node node;
    size_t counter = 0;
    while (file >> node.t >> node.id >> node.cx >> node.cy >> node.probability_birth_termination)
    {
        if (node.t == problem.node_offsets.size())
            problem.node_offsets.push_back(counter);

        problem.nodes.push_back(node);
        ++counter;
    }

    problem.node_offsets.push_back(counter);

    file.close();

    return counter;
}